

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Direction.cpp
# Opt level: O3

void __thiscall iDynTree::Direction::Direction(Direction *this,double *in_data,uint in_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  if (in_size == 3) {
    dVar3 = in_data[1];
    (this->super_Vector3).m_data[0] = *in_data;
    (this->super_Vector3).m_data[1] = dVar3;
    (this->super_Vector3).m_data[2] = in_data[2];
    auVar2 = *(undefined1 (*) [16])(this->super_Vector3).m_data;
    dVar3 = (this->super_Vector3).m_data[2];
  }
  else {
    reportError("VectorFixSize","constructor",
                "input vector does not have the right number of elements");
    auVar2 = ZEXT816(0);
    *(undefined1 (*) [16])(this->super_Vector3).m_data = auVar2;
    (this->super_Vector3).m_data[2] = 0.0;
    dVar3 = 0.0;
  }
  dVar6 = dVar3 * dVar3 + auVar2._8_8_ * auVar2._8_8_ + auVar2._0_8_ * auVar2._0_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar6;
  auVar5 = sqrtpd(auVar5,auVar5);
  dVar4 = auVar5._0_8_;
  if (DEFAULT_TOL <= dVar4) {
    if (0.0 < dVar6) {
      auVar1._8_8_ = dVar4;
      auVar1._0_8_ = dVar4;
      auVar2 = divpd(auVar2,auVar1);
      *(undefined1 (*) [16])(this->super_Vector3).m_data = auVar2;
      (this->super_Vector3).m_data[2] = dVar3 / dVar4;
    }
  }
  else {
    (this->super_Vector3).m_data[0] = 1.0;
    (this->super_Vector3).m_data[1] = 0.0;
    (this->super_Vector3).m_data[2] = 0.0;
  }
  return;
}

Assistant:

Direction::Direction(const double* in_data, const unsigned int in_size):
                 VectorFixSize< 3 >(in_data,in_size)
    {
        this->Normalize();
    }